

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_soup_mesh_builder.cc
# Opt level: O1

void __thiscall
draco::TriangleSoupMeshBuilder::SetAttributeValuesForFace
          (TriangleSoupMeshBuilder *this,int att_id,FaceIndex face_id,void *corner_value_0,
          void *corner_value_1,void *corner_value_2)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  Face local_3c;
  
  puVar1 = *(undefined8 **)
            (*(long *)&(((this->mesh_)._M_t.
                         super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
                         super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
                         super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl)->super_PointCloud
                       ).attributes_.
                       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                       ._M_impl + (long)att_id * 8);
  memcpy((void *)(puVar1[5] * (ulong)(face_id.value_ * 3) + *(long *)*puVar1),corner_value_0,
         puVar1[5]);
  uVar2 = face_id.value_ * 3 + 1;
  memcpy((void *)(puVar1[5] * (ulong)uVar2 + *(long *)*puVar1),corner_value_1,puVar1[5]);
  uVar3 = face_id.value_ * 3 + 2;
  memcpy((void *)(puVar1[5] * (ulong)uVar3 + *(long *)*puVar1),corner_value_2,puVar1[5]);
  local_3c._M_elems[0].value_ = face_id.value_ * 3;
  local_3c._M_elems[1].value_ = uVar2;
  local_3c._M_elems[2].value_ = uVar3;
  Mesh::SetFace((this->mesh_)._M_t.
                super___uniq_ptr_impl<draco::Mesh,_std::default_delete<draco::Mesh>_>._M_t.
                super__Tuple_impl<0UL,_draco::Mesh_*,_std::default_delete<draco::Mesh>_>.
                super__Head_base<0UL,_draco::Mesh_*,_false>._M_head_impl,face_id,&local_3c);
  (this->attribute_element_types_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
  _M_impl.super__Vector_impl_data._M_start[att_id] = '\x01';
  return;
}

Assistant:

void TriangleSoupMeshBuilder::SetAttributeValuesForFace(
    int att_id, FaceIndex face_id, const void *corner_value_0,
    const void *corner_value_1, const void *corner_value_2) {
  const int start_index = 3 * face_id.value();
  PointAttribute *const att = mesh_->attribute(att_id);
  att->SetAttributeValue(AttributeValueIndex(start_index), corner_value_0);
  att->SetAttributeValue(AttributeValueIndex(start_index + 1), corner_value_1);
  att->SetAttributeValue(AttributeValueIndex(start_index + 2), corner_value_2);
  mesh_->SetFace(face_id,
                 {{PointIndex(start_index), PointIndex(start_index + 1),
                   PointIndex(start_index + 2)}});
  attribute_element_types_[att_id] = MESH_CORNER_ATTRIBUTE;
}